

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O1

string * trim(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = str->_M_string_length;
  uVar4 = uVar6 & 0xffffffff;
  uVar2 = (int)uVar6 - 1;
  uVar5 = 0xffffffff;
  if ((int)uVar2 < -1) {
    uVar5 = uVar2;
  }
  do {
    uVar4 = uVar4 - 1;
    uVar7 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar7;
    uVar2 = uVar5;
    if ((int)uVar7 < 0) break;
    iVar3 = isspace((int)(str->_M_dataplus)._M_p[(uint)uVar4 & 0x7fffffff]);
    uVar2 = uVar7;
  } while (iVar3 != 0);
  if (-1 < (int)uVar2) {
    pcVar1 = (str->_M_dataplus)._M_p;
    uVar6 = 0;
    do {
      iVar3 = isspace((int)pcVar1[uVar6]);
      if (iVar3 == 0) break;
      uVar6 = uVar6 + 1;
    } while (uVar2 + 1 != uVar6);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

string trim(string str) {
   int finish = str.length() - 1;
   while (finish >= 0 && isspace(str[finish])) {
      finish--;
   }
   int start = 0;
   while (start <= finish && isspace(str[start])) {
      start++;
   }
   return str.substr(start, finish - start + 1);
}